

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall AInterpolationPoint::FormChain(AInterpolationPoint *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AInterpolationPoint *pAVar4;
  undefined1 local_28 [8];
  TActorIterator<AInterpolationPoint> iterator;
  AInterpolationPoint *this_local;
  
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)&iterator.super_FActorIterator.field_0xc,
             (int)this + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int
                    ((TFlags *)&iterator.super_FActorIterator.field_0xc);
  if (uVar2 == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&(this->super_AActor).flags,MF_AMBUSH);
    TActorIterator<AInterpolationPoint>::TActorIterator
              ((TActorIterator<AInterpolationPoint> *)local_28,
               (this->super_AActor).args[3] + (this->super_AActor).args[4] * 0x100);
    pAVar4 = TActorIterator<AInterpolationPoint>::Next
                       ((TActorIterator<AInterpolationPoint> *)local_28);
    TObjPtr<AInterpolationPoint>::operator=(&this->Next,pAVar4);
    bVar1 = TObjPtr<AInterpolationPoint>::operator==(&this->Next,this);
    if (bVar1) {
      pAVar4 = TActorIterator<AInterpolationPoint>::Next
                         ((TActorIterator<AInterpolationPoint> *)local_28);
      TObjPtr<AInterpolationPoint>::operator=(&this->Next,pAVar4);
    }
    bVar1 = TObjPtr<AInterpolationPoint>::operator==(&this->Next,(AInterpolationPoint *)0x0);
    if ((bVar1) && ((this->super_AActor).args[3] != 0 || (this->super_AActor).args[4] != 0)) {
      Printf("Can\'t find target for camera node %d\n",(ulong)(uint)(this->super_AActor).tid);
    }
    iVar3 = clamp<int>((int)(char)(this->super_AActor).args[0],-0x59,0x59);
    TAngle<double>::operator=(&(this->super_AActor).Angles.Pitch,(double)iVar3);
    bVar1 = TObjPtr<AInterpolationPoint>::operator!=(&this->Next,(AInterpolationPoint *)0x0);
    if (bVar1) {
      pAVar4 = TObjPtr<AInterpolationPoint>::operator->(&this->Next);
      FormChain(pAVar4);
    }
  }
  return;
}

Assistant:

void AInterpolationPoint::FormChain ()
{
	if (flags & MF_AMBUSH)
		return;

	flags |= MF_AMBUSH;

	TActorIterator<AInterpolationPoint> iterator (args[3] + 256 * args[4]);
	Next = iterator.Next ();

	if (Next == this)	// Don't link to self
		Next = iterator.Next ();

	if (Next == NULL && (args[3] | args[4]))
		Printf ("Can't find target for camera node %d\n", tid);

	Angles.Pitch = (double)clamp<int>((signed char)args[0], -89, 89);

	if (Next != NULL)
		Next->FormChain ();
}